

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteSegment(Fts3Table *p,Fts3SegReader *pSeg)

{
  sqlite3_stmt *local_28;
  sqlite3_stmt *pDelete;
  Fts3SegReader *pFStack_18;
  int rc;
  Fts3SegReader *pSeg_local;
  Fts3Table *p_local;
  
  pDelete._4_4_ = 0;
  if ((pSeg->iStartBlock != 0) &&
     (pFStack_18 = pSeg, pSeg_local = (Fts3SegReader *)p,
     pDelete._4_4_ = fts3SqlStmt(p,0x11,&local_28,(sqlite3_value **)0x0), pDelete._4_4_ == 0)) {
    sqlite3_bind_int64(local_28,1,pFStack_18->iStartBlock);
    sqlite3_bind_int64(local_28,2,pFStack_18->iEndBlock);
    sqlite3_step(local_28);
    pDelete._4_4_ = sqlite3_reset(local_28);
  }
  return pDelete._4_4_;
}

Assistant:

static int fts3DeleteSegment(
  Fts3Table *p,                   /* FTS table handle */
  Fts3SegReader *pSeg             /* Segment to delete */
){
  int rc = SQLITE_OK;             /* Return code */
  if( pSeg->iStartBlock ){
    sqlite3_stmt *pDelete;        /* SQL statement to delete rows */
    rc = fts3SqlStmt(p, SQL_DELETE_SEGMENTS_RANGE, &pDelete, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDelete, 1, pSeg->iStartBlock);
      sqlite3_bind_int64(pDelete, 2, pSeg->iEndBlock);
      sqlite3_step(pDelete);
      rc = sqlite3_reset(pDelete);
    }
  }
  return rc;
}